

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_parser.cpp
# Opt level: O2

void ParseSingleFile(char *filename,int lump,void *parser,ZCCParseState *state)

{
  bool bVar1;
  uint uVar2;
  TokenMapEntry *pTVar3;
  ulong uVar4;
  int yymajor;
  undefined4 in_register_00000034;
  ZCCToken yyminor;
  ZCCToken yyminor_00;
  anon_union_8_3_77c0fe9c_for_ZCCToken_0 local_140;
  undefined1 local_138 [8];
  FScanner sc;
  
  uVar4 = (ulong)filename & 0xffffffff;
  FScanner::FScanner(&sc);
  FScanner::OpenLumpNum(&sc,(int)filename);
  *(FScanner **)((long)parser + 0x838) = &sc;
  do {
    bVar1 = FScanner::GetToken(&sc);
    if (!bVar1) {
LAB_00544589:
      local_140.Int = 0xffffffff;
      yyminor_00._8_8_ = uVar4;
      yyminor_00.field_0.Float = local_140.Float;
      ZCCParse((void *)CONCAT44(in_register_00000034,lump),0x30,yyminor_00,(ZCCParseState *)parser);
      *(undefined8 *)((long)parser + 0x838) = 0;
      FScanner::~FScanner(&sc);
      return;
    }
    uVar2 = FScanner::GetMessageLine(&sc);
    uVar4 = (ulong)uVar2;
    switch(sc.TokenType) {
    case 0x101:
      FName::FName((FName *)local_138,sc.String);
      local_140.Int = local_138._0_4_;
      yymajor = 0x36;
      break;
    case 0x102:
      local_140.String =
           FSharedStringArena::Alloc((FSharedStringArena *)parser,sc.String,(long)sc.StringLen);
      yymajor = 0x52;
      break;
    case 0x103:
      local_140.Int = sc.Name.Index;
      yymajor = 0x80;
      break;
    case 0x104:
      local_140.Int = sc.Number;
      yymajor = 0x7d;
      break;
    case 0x105:
      local_140.Int = sc.Number;
      yymajor = 0x7e;
      break;
    case 0x106:
      local_140.Float = sc.Float;
      yymajor = 0x7f;
      break;
    case 0x107:
      FName::FName((FName *)local_138,sc.String);
      local_140.Int = local_138._0_4_;
      yymajor = 0x44;
      break;
    default:
      pTVar3 = TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::
               CheckKey(&TokenMap,(short)sc.TokenType);
      if (pTVar3 == (TokenMapEntry *)0x0) {
        FScanner::TokenName((FScanner *)local_138,sc.TokenType,(char *)0x0);
        FScanner::ScriptMessage
                  (&sc,"Unexpected token %s.\n",CONCAT44(local_138._4_4_,local_138._0_4_));
        FString::~FString((FString *)local_138);
        goto LAB_00544589;
      }
      yymajor = (int)pTVar3->TokenType;
      local_140.Int._2_2_ = 0;
      local_140.Int._0_2_ = pTVar3->TokenName;
    }
    yyminor.SourceLoc = uVar2;
    yyminor.field_0 = local_140;
    yyminor._12_4_ = 0;
    ZCCParse((void *)CONCAT44(in_register_00000034,lump),yymajor,yyminor,(ZCCParseState *)parser);
  } while( true );
}

Assistant:

static void ParseSingleFile(const char *filename, int lump, void *parser, ZCCParseState &state)
{
	int tokentype;
	//bool failed;
	ZCCToken value;
	FScanner sc;

	if (filename != nullptr)
	{
		lump = Wads.CheckNumForFullName(filename, true);
		if (lump >= 0)
		{
			sc.OpenLumpNum(lump);
		}
		else
		{
			Printf("Could not find script lump '%s'\n", filename);
			return;
		}
	}
	else sc.OpenLumpNum(lump);

	state.sc = &sc;
	while (sc.GetToken())
	{
		value.SourceLoc = sc.GetMessageLine();
		switch (sc.TokenType)
		{
		case TK_StringConst:
			value.String = state.Strings.Alloc(sc.String, sc.StringLen);
			tokentype = ZCC_STRCONST;
			break;

		case TK_NameConst:
			value.Int = sc.Name;
			tokentype = ZCC_NAMECONST;
			break;

		case TK_IntConst:
			value.Int = sc.Number;
			tokentype = ZCC_INTCONST;
			break;

		case TK_UIntConst:
			value.Int = sc.Number;
			tokentype = ZCC_UINTCONST;
			break;

		case TK_FloatConst:
			value.Float = sc.Float;
			tokentype = ZCC_FLOATCONST;
			break;

		case TK_Identifier:
			value.Int = FName(sc.String);
			tokentype = ZCC_IDENTIFIER;
			break;

		case TK_NonWhitespace:
			value.Int = FName(sc.String);
			tokentype = ZCC_NWS;
			break;

		default:
			TokenMapEntry *zcctoken = TokenMap.CheckKey(sc.TokenType);
			if (zcctoken != nullptr)
			{
				tokentype = zcctoken->TokenType;
				value.Int = zcctoken->TokenName;
			}
			else
			{
				sc.ScriptMessage("Unexpected token %s.\n", sc.TokenName(sc.TokenType).GetChars());
				goto parse_end;
			}
			break;
		}
		ZCCParse(parser, tokentype, value, &state);
	}
parse_end:
	value.Int = -1;
	ZCCParse(parser, ZCC_EOF, value, &state);
	state.sc = nullptr;
}